

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void auto_arima_predict(auto_arima_object obj,double *inp,double *xreg,int L,double *newxreg,
                       double *xpred,double *amse)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int d;
  uint N;
  int D;
  int iVar6;
  uint ip;
  int iVar7;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  uint id;
  long lVar16;
  double dVar17;
  double *local_b0;
  double local_40;
  
  uVar1 = obj->p;
  uVar2 = obj->q;
  uVar3 = obj->P;
  uVar4 = obj->Q;
  iVar5 = obj->s;
  lVar16 = (long)iVar5;
  ip = iVar5 * uVar3 + uVar1;
  uVar11 = iVar5 * uVar4 + uVar2 + 1;
  if ((int)uVar11 < (int)ip) {
    uVar11 = ip;
  }
  d = obj->d;
  N = obj->N;
  D = obj->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar7 = iVar5 * D;
  C_00 = (double *)malloc((long)iVar7 * 8 + 8);
  id = iVar7 + d;
  oup = (double *)malloc((long)(int)id * 8 + 8);
  __size = (long)(int)N * 8;
  W = (double *)malloc(__size);
  resid = (double *)malloc(__size);
  iVar6 = obj->idrift;
  phi = (double *)malloc((long)(int)uVar11 << 3);
  theta = (double *)malloc((long)(int)uVar11 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    local_40 = obj->mean;
  }
  else {
    if (0 < d) {
      deld(d,C);
    }
    local_40 = 0.0;
    if (0 < D) {
      delds(D,iVar5,C_00);
    }
  }
  conv(C,d + 1,C_00,iVar7 + 1,oup);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)id) {
    uVar9 = (ulong)id;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    oup[uVar8 + 1] = -oup[uVar8 + 1];
  }
  uVar9 = (ulong)(iVar6 == 1);
  uVar8 = 0;
  uVar12 = 0;
  local_b0 = xreg;
  if (0 < (int)N) {
    uVar12 = (ulong)N;
  }
  for (; uVar8 != uVar12; uVar8 = uVar8 + 1) {
    dVar17 = inp[uVar8];
    if (D == 0 && d == 0) {
      dVar17 = dVar17 - local_40;
    }
    W[uVar8] = dVar17;
    if (obj->idrift == 1) {
      dVar17 = dVar17 - (double)((int)uVar8 + 1) * *obj->exog;
      W[uVar8] = dVar17;
    }
    iVar6 = obj->r;
    pdVar14 = local_b0;
    uVar10 = uVar9;
    if (0 < (long)iVar6) {
      for (; (long)iVar6 != uVar10; uVar10 = uVar10 + 1) {
        dVar17 = dVar17 - obj->exog[uVar10] * *pdVar14;
        W[uVar8] = dVar17;
        pdVar14 = pdVar14 + (int)N;
      }
    }
    resid[uVar8] = obj->res[uVar8];
    local_b0 = local_b0 + 1;
  }
  uVar12 = 0;
  uVar8 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar8 = uVar12;
  }
  for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    theta[uVar12] = 0.0;
    phi[uVar12] = 0.0;
  }
  uVar12 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar12;
  }
  for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    phi[uVar12] = obj->phi[uVar12];
  }
  uVar10 = 0;
  uVar12 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar12 = uVar10;
  }
  for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
    theta[uVar10] = -obj->theta[uVar10];
  }
  uVar13 = 0;
  pdVar14 = phi;
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = uVar13;
  }
  while (pdVar14 = pdVar14 + lVar16, uVar13 != uVar10) {
    dVar17 = obj->PHI[uVar13];
    uVar13 = uVar13 + 1;
    phi[uVar13 * lVar16 + -1] = phi[uVar13 * lVar16 + -1] + dVar17;
    for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
      pdVar14[uVar15] = pdVar14[uVar15] - obj->phi[uVar15] * dVar17;
    }
  }
  uVar10 = 0;
  pdVar14 = theta;
  uVar8 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar8 = uVar10;
  }
  while (pdVar14 = pdVar14 + lVar16, uVar10 != uVar8) {
    dVar17 = obj->THETA[uVar10];
    uVar10 = uVar10 + 1;
    theta[uVar10 * lVar16 + -1] = theta[uVar10 * lVar16 + -1] - dVar17;
    for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      pdVar14[uVar13] = obj->theta[uVar13] * dVar17 + pdVar14[uVar13];
    }
  }
  forkal(ip,iVar5 * uVar4 + uVar2,id,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  uVar12 = 0;
  uVar8 = 0;
  if (0 < L) {
    uVar8 = (ulong)(uint)L;
  }
  for (; uVar12 != uVar8; uVar12 = uVar12 + 1) {
    dVar17 = xpred[uVar12] + local_40;
    xpred[uVar12] = dVar17;
    if (obj->idrift == 1) {
      dVar17 = dVar17 + (double)(int)(N + 1 + (int)uVar12) * *obj->exog;
      xpred[uVar12] = dVar17;
    }
    iVar5 = obj->r;
    pdVar14 = newxreg;
    for (uVar10 = uVar9; (long)uVar10 < (long)iVar5; uVar10 = uVar10 + 1) {
      dVar17 = dVar17 + obj->exog[uVar10] * *pdVar14;
      xpred[uVar12] = dVar17;
      pdVar14 = pdVar14 + L;
    }
    newxreg = newxreg + 1;
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void auto_arima_predict(auto_arima_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j,diter;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	p = obj->p;
	q = obj->q;
	D = obj->D;
	P = obj->P;
	Q = obj->Q;
	s = obj->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	diter = 0;

	if (obj->idrift == 1) {
		diter = 1;		
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->idrift == 1) {
			W[i] -= obj->exog[0]*(i+1);
		}
		if (obj->r > 0) {
			for(j = diter; j < obj->r;++j) {
				W[i] -= obj->exog[j] * xreg[(j-diter)*N+i];
			}
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->phi[i] * obj->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->theta[i] * obj->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		if (obj->idrift == 1) {
			xpred[i] += obj->exog[0]*(i+1+N);
		}
		for(j = diter; j < obj->r;++j) {
			xpred[i] += obj->exog[j] * newxreg[(j - diter)*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}